

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O3

void Cec_CnfNodeAddToSolver(Cec_ManSat_t *p,Gia_Obj_t *pObj)

{
  size_t sVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  int iVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  
  pGVar2 = p->pAig->pObjs;
  if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->pAig->nObjs)) {
    if (p->pSatVars[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555] != 0) {
      return;
    }
    uVar4 = (uint)*(undefined8 *)pObj;
    if ((~uVar4 & 0x9fffffff) != 0) {
      if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                      ,0x141,"void Cec_CnfNodeAddToSolver(Cec_ManSat_t *, Gia_Obj_t *)");
      }
      pVVar7 = (Vec_Ptr_t *)malloc(0x10);
      pVVar7->nCap = 100;
      pVVar7->nSize = 0;
      ppvVar6 = (void **)malloc(800);
      pVVar7->pArray = ppvVar6;
      Cec_ObjAddToFrontier(p,pObj,pVVar7);
      if (0 < pVVar7->nSize) {
        lVar13 = 0;
        do {
          pGVar2 = (Gia_Obj_t *)pVVar7->pArray[lVar13];
          pGVar3 = p->pAig->pObjs;
          if ((pGVar2 < pGVar3) || (pGVar3 + p->pAig->nObjs <= pGVar2)) goto LAB_0065a1c5;
          if (p->pSatVars[(int)((ulong)((long)pGVar2 - (long)pGVar3) >> 2) * -0x55555555] == 0) {
            __assert_fail("Cec_ObjSatNum(p,pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                          ,0x149,"void Cec_CnfNodeAddToSolver(Cec_ManSat_t *, Gia_Obj_t *)");
          }
          iVar5 = Gia_ObjIsMuxType(pGVar2);
          pVVar8 = p->vFanins;
          if (iVar5 == 0) {
            Cec_CollectSuper(pGVar2,1,pVVar8);
            pVVar8 = p->vFanins;
            if (0 < pVVar8->nSize) {
              lVar15 = 0;
              do {
                Cec_ObjAddToFrontier
                          (p,(Gia_Obj_t *)((ulong)pVVar8->pArray[lVar15] & 0xfffffffffffffffe),
                           pVVar7);
                lVar15 = lVar15 + 1;
                pVVar8 = p->vFanins;
              } while (lVar15 < pVVar8->nSize);
            }
            Cec_AddClausesSuper(p,pGVar2,pVVar8);
          }
          else {
            pVVar8->nSize = 0;
            uVar14 = *(ulong *)pGVar2;
            uVar10 = *(ulong *)(pGVar2 + -(uVar14 & 0x1fffffff));
            iVar5 = 0;
            ppvVar6 = pVVar8->pArray;
            if (pVVar8->nCap == 0) {
              if (ppvVar6 == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
                iVar5 = 0;
              }
              else {
                ppvVar6 = (void **)realloc(ppvVar6,0x80);
                iVar5 = pVVar8->nSize;
              }
              pVVar8->pArray = ppvVar6;
              pVVar8->nCap = 0x10;
            }
            pVVar8->nSize = iVar5 + 1;
            ppvVar6[iVar5] = pGVar2 + (-(uVar14 & 0x1fffffff) - (uVar10 & 0x1fffffff));
            pVVar8 = p->vFanins;
            uVar10 = *(ulong *)pGVar2;
            pGVar3 = pGVar2 + -(uVar10 >> 0x20 & 0x1fffffff);
            uVar14 = *(ulong *)pGVar3;
            uVar4 = pVVar8->nSize;
            uVar12 = (ulong)uVar4;
            if (0 < (int)uVar4) {
              uVar9 = 0;
              do {
                if ((Gia_Obj_t *)pVVar8->pArray[uVar9] == pGVar3 + -(uVar14 & 0x1fffffff))
                goto LAB_00659ef6;
                uVar9 = uVar9 + 1;
              } while (uVar12 != uVar9);
            }
            if (uVar4 == pVVar8->nCap) {
              if ((int)uVar4 < 0x10) {
                if (pVVar8->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar8->pArray,0x80);
                }
                pVVar8->pArray = ppvVar6;
                pVVar8->nCap = 0x10;
              }
              else {
                if (pVVar8->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(uVar12 << 4);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar8->pArray,uVar12 << 4);
                }
                pVVar8->pArray = ppvVar6;
                pVVar8->nCap = uVar4 * 2;
              }
            }
            else {
              ppvVar6 = pVVar8->pArray;
            }
            iVar5 = pVVar8->nSize;
            pVVar8->nSize = iVar5 + 1;
            ppvVar6[iVar5] = pGVar3 + -(uVar14 & 0x1fffffff);
            pVVar8 = p->vFanins;
            uVar10 = *(ulong *)pGVar2;
            uVar12 = (ulong)(uint)pVVar8->nSize;
LAB_00659ef6:
            uVar4 = *(uint *)&pGVar2[-(uVar10 & 0x1fffffff)].field_0x4;
            uVar11 = (uint)uVar12;
            if (0 < (int)uVar11) {
              uVar14 = 0;
              do {
                if ((Gia_Obj_t *)pVVar8->pArray[uVar14] ==
                    pGVar2 + (-(uVar10 & 0x1fffffff) - ((ulong)uVar4 & 0x1fffffff)))
                goto LAB_00659fc6;
                uVar14 = uVar14 + 1;
              } while (uVar12 != uVar14);
            }
            if (uVar11 == pVVar8->nCap) {
              if ((int)uVar11 < 0x10) {
                if (pVVar8->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar8->pArray,0x80);
                }
                pVVar8->pArray = ppvVar6;
                pVVar8->nCap = 0x10;
              }
              else {
                sVar1 = (ulong)(uVar11 * 2) * 8;
                if (pVVar8->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(sVar1);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar8->pArray,sVar1);
                }
                pVVar8->pArray = ppvVar6;
                pVVar8->nCap = uVar11 * 2;
              }
            }
            else {
              ppvVar6 = pVVar8->pArray;
            }
            iVar5 = pVVar8->nSize;
            pVVar8->nSize = iVar5 + 1;
            ppvVar6[iVar5] = pGVar2 + (-(uVar10 & 0x1fffffff) - ((ulong)uVar4 & 0x1fffffff));
            pVVar8 = p->vFanins;
            uVar10 = *(ulong *)pGVar2;
            uVar11 = pVVar8->nSize;
LAB_00659fc6:
            uVar14 = uVar10 >> 0x20 & 0x1fffffff;
            uVar4 = *(uint *)&pGVar2[-uVar14].field_0x4;
            if (0 < (int)uVar11) {
              uVar10 = 0;
              do {
                if ((Gia_Obj_t *)pVVar8->pArray[uVar10] ==
                    pGVar2 + (-uVar14 - ((ulong)uVar4 & 0x1fffffff))) goto LAB_0065a0a1;
                uVar10 = uVar10 + 1;
              } while (uVar11 != uVar10);
            }
            if (uVar11 == pVVar8->nCap) {
              if ((int)uVar11 < 0x10) {
                if (pVVar8->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar8->pArray,0x80);
                }
                pVVar8->pArray = ppvVar6;
                pVVar8->nCap = 0x10;
              }
              else {
                sVar1 = (ulong)(uVar11 * 2) * 8;
                if (pVVar8->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(sVar1);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar8->pArray,sVar1);
                }
                pVVar8->pArray = ppvVar6;
                pVVar8->nCap = uVar11 * 2;
              }
            }
            else {
              ppvVar6 = pVVar8->pArray;
            }
            iVar5 = pVVar8->nSize;
            pVVar8->nSize = iVar5 + 1;
            ppvVar6[iVar5] = pGVar2 + (-uVar14 - ((ulong)uVar4 & 0x1fffffff));
            pVVar8 = p->vFanins;
            if (0 < pVVar8->nSize) {
LAB_0065a0a1:
              lVar15 = 0;
              do {
                Cec_ObjAddToFrontier
                          (p,(Gia_Obj_t *)((ulong)pVVar8->pArray[lVar15] & 0xfffffffffffffffe),
                           pVVar7);
                lVar15 = lVar15 + 1;
                pVVar8 = p->vFanins;
              } while (lVar15 < pVVar8->nSize);
            }
            Cec_AddClausesMux(p,pGVar2);
          }
          if (p->vFanins->nSize < 2) {
            __assert_fail("Vec_PtrSize(p->vFanins) > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                          ,0x15c,"void Cec_CnfNodeAddToSolver(Cec_ManSat_t *, Gia_Obj_t *)");
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < pVVar7->nSize);
      }
      if (pVVar7->pArray != (void **)0x0) {
        free(pVVar7->pArray);
      }
      free(pVVar7);
      return;
    }
    pVVar7 = p->vUsedNodes;
    uVar4 = pVVar7->nSize;
    if (uVar4 == pVVar7->nCap) {
      if ((int)uVar4 < 0x10) {
        if (pVVar7->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar7->pArray,0x80);
        }
        pVVar7->pArray = ppvVar6;
        pVVar7->nCap = 0x10;
      }
      else {
        if (pVVar7->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar4 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar7->pArray,(ulong)uVar4 << 4);
        }
        pVVar7->pArray = ppvVar6;
        pVVar7->nCap = uVar4 * 2;
      }
    }
    else {
      ppvVar6 = pVVar7->pArray;
    }
    iVar5 = pVVar7->nSize;
    pVVar7->nSize = iVar5 + 1;
    ppvVar6[iVar5] = pObj;
    iVar5 = p->nSatVars;
    p->nSatVars = iVar5 + 1;
    pGVar2 = p->pAig->pObjs;
    if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->pAig->nObjs)) {
      p->pSatVars[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555] = iVar5;
      sat_solver_setnvars(p->pSat,p->nSatVars);
      return;
    }
  }
LAB_0065a1c5:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_CnfNodeAddToSolver( Cec_ManSat_t * p, Gia_Obj_t * pObj )
{ 
    Vec_Ptr_t * vFrontier;
    Gia_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    // quit if CNF is ready
    if ( Cec_ObjSatNum(p,pObj) )
        return;
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_PtrPush( p->vUsedNodes, pObj );
        Cec_ObjSetSatNum( p, pObj, p->nSatVars++ );
        sat_solver_setnvars( p->pSat, p->nSatVars );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    Cec_ObjAddToFrontier( p, pObj, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Gia_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Cec_ObjSatNum(p,pNode) );
        if ( fUseMuxes && Gia_ObjIsMuxType(pNode) )
        {
            Vec_PtrClear( p->vFanins );
            Vec_PtrPushUnique( p->vFanins, Gia_ObjFanin0( Gia_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Gia_ObjFanin0( Gia_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Gia_ObjFanin1( Gia_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Gia_ObjFanin1( Gia_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Gia_Obj_t *, p->vFanins, pFanin, k )
                Cec_ObjAddToFrontier( p, Gia_Regular(pFanin), vFrontier );
            Cec_AddClausesMux( p, pNode );
        }
        else
        {
            Cec_CollectSuper( pNode, fUseMuxes, p->vFanins );
            Vec_PtrForEachEntry( Gia_Obj_t *, p->vFanins, pFanin, k )
                Cec_ObjAddToFrontier( p, Gia_Regular(pFanin), vFrontier );
            Cec_AddClausesSuper( p, pNode, p->vFanins );
        }
        assert( Vec_PtrSize(p->vFanins) > 1 );
    }
    Vec_PtrFree( vFrontier );
}